

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

bool __thiscall Json::CharReaderBuilder::validate(CharReaderBuilder *this,Value *invalid)

{
  bool bVar1;
  int iVar2;
  const_iterator cVar3;
  Value *other;
  Value *this_00;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar4;
  Value *this_01;
  long *plVar5;
  byte bVar6;
  long lVar7;
  const_iterator cVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  String key;
  allocator_type local_1c9;
  CharReaderBuilder *local_1c8;
  ValueIteratorBase local_1c0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if ((validate(Json::Value*)::valid_keys_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&validate(Json::Value*)::valid_keys_abi_cxx11_), iVar2 != 0)) {
    local_1c8 = this;
    psVar4 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)operator_new(0x30);
    local_1b0._0_8_ = &local_1a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"collectComments","");
    local_190[0] = local_180;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"allowComments","");
    local_170[0] = local_160;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"allowTrailingCommas","");
    local_150[0] = local_140;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"strictRoot","");
    local_130[0] = local_120;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_130,"allowDroppedNullPlaceholders","");
    local_110[0] = local_100;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"allowNumericKeys","");
    local_f0[0] = local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"allowSingleQuotes","");
    local_d0[0] = local_c0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"stackLimit","");
    local_b0[0] = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"failIfExtra","");
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"rejectDupKeys","");
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"allowSpecialFloats","");
    plVar5 = local_40;
    local_50[0] = plVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"skipBom","");
    __l._M_len = 0xc;
    __l._M_array = (iterator)local_1b0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set(psVar4,__l,
          (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
          &local_1c0,&local_1c9);
    lVar7 = -0x180;
    do {
      if (plVar5 != (long *)plVar5[-2]) {
        operator_delete((long *)plVar5[-2],*plVar5 + 1);
      }
      plVar5 = plVar5 + -4;
      lVar7 = lVar7 + 0x20;
    } while (lVar7 != 0);
    validate(Json::Value*)::valid_keys_abi_cxx11_ = psVar4;
    __cxa_guard_release(&validate(Json::Value*)::valid_keys_abi_cxx11_);
    this = local_1c8;
  }
  this_01 = &this->settings_;
  cVar8 = Value::begin(this_01);
  local_1c0.current_ = cVar8.super_ValueIteratorBase.current_._M_node;
  local_1c0.isNull_ = cVar8.super_ValueIteratorBase.isNull_;
  cVar8 = Value::end(this_01);
  local_1b0._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
  local_1b0[8] = cVar8.super_ValueIteratorBase.isNull_;
  bVar1 = ValueIteratorBase::isEqual(&local_1c0,(SelfType *)local_1b0);
  if (!bVar1) {
    do {
      ValueIteratorBase::name_abi_cxx11_((String *)local_1b0,&local_1c0);
      psVar4 = validate(Json::Value*)::valid_keys_abi_cxx11_;
      cVar3 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&validate(Json::Value*)::valid_keys_abi_cxx11_->_M_t,(String *)local_1b0);
      bVar1 = (_Rb_tree_header *)cVar3._M_node != &(psVar4->_M_t)._M_impl.super__Rb_tree_header;
      if (invalid == (Value *)0x0 || bVar1) {
        bVar6 = bVar1 * '\x03' + 1;
      }
      else {
        other = ValueIteratorBase::deref(&local_1c0);
        this_00 = Value::operator[](invalid,(String *)local_1b0);
        bVar6 = 0;
        Value::operator=(this_00,other);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ != &local_1a0) {
        operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
      }
      if ((bVar6 & 3) != 0) {
        return false;
      }
      ValueIteratorBase::increment(&local_1c0);
      cVar8 = Value::end(this_01);
      local_1b0._0_8_ = cVar8.super_ValueIteratorBase.current_._M_node;
      local_1b0[8] = cVar8.super_ValueIteratorBase.isNull_;
      bVar1 = ValueIteratorBase::isEqual(&local_1c0,(SelfType *)local_1b0);
    } while (!bVar1);
  }
  if (invalid == (Value *)0x0) {
    bVar1 = true;
  }
  else {
    bVar1 = Value::empty(invalid);
  }
  return bVar1;
}

Assistant:

bool CharReaderBuilder::validate(Json::Value* invalid) const {
  static const auto& valid_keys = *new std::set<String>{
      "collectComments",
      "allowComments",
      "allowTrailingCommas",
      "strictRoot",
      "allowDroppedNullPlaceholders",
      "allowNumericKeys",
      "allowSingleQuotes",
      "stackLimit",
      "failIfExtra",
      "rejectDupKeys",
      "allowSpecialFloats",
      "skipBom",
  };
  for (auto si = settings_.begin(); si != settings_.end(); ++si) {
    auto key = si.name();
    if (valid_keys.count(key))
      continue;
    if (invalid)
      (*invalid)[key] = *si;
    else
      return false;
  }
  return invalid ? invalid->empty() : true;
}